

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O1

void __thiscall
tchecker::local_array_statement_t::local_array_statement_t
          (local_array_statement_t *this,shared_ptr<const_tchecker::var_expression_t> *variable,
          shared_ptr<const_tchecker::expression_t> *size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  invalid_argument *this_00;
  
  *(undefined ***)this = &PTR__local_array_statement_t_0027d398;
  (this->_variable).super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (variable->
            super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var1 = (variable->
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_variable).super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_size).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (size->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var1 = (size->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_size).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if ((this->_variable).
      super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr local variable");
  }
  else {
    if ((this->_size).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr size");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

local_array_statement_t::local_array_statement_t(std::shared_ptr<tchecker::var_expression_t const> const & variable,
                                                 std::shared_ptr<tchecker::expression_t const> const & size)
    : _variable(variable), _size(size)
{
  if (_variable.get() == nullptr)
    throw std::invalid_argument("nullptr local variable");
  if (_size.get() == nullptr)
    throw std::invalid_argument("nullptr size");
}